

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

string * __thiscall
AmpIO::GetQLASerialNumber_abi_cxx11_(string *__return_storage_ptr__,AmpIO *this,uchar chan)

{
  uint8_t *data_00;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  size_t i;
  long lVar4;
  uint8_t data [20];
  int local_48 [3];
  undefined1 local_3c;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  lVar4 = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_3c = 0;
  do {
    if (lVar4 == 0xc) {
LAB_00106a25:
      if ((local_48[0] == 0x20415264) || (local_48[0] == 0x20414c51)) {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    data_00 = (uint8_t *)((long)local_48 + lVar4);
    bVar1 = FpgaIO::PromReadByte25AA128(&this->super_FpgaIO,(uint16_t)lVar4,data_00,chan);
    if (!bVar1) {
      if (chan == '\0') {
        pcVar3 = "AmpIO::GetQLASerialNumber: failed to get QLA Serial Number";
        poVar2 = (ostream *)&std::cerr;
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "AmpIO::GetQLASerialNumber: failed to get QLA ");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        pcVar3 = " Serial Number";
      }
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::endl<char,std::char_traits<char>>(poVar2);
      goto LAB_00106a25;
    }
    if (*data_00 == 0xff) {
      *data_00 = '\0';
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

std::string AmpIO::GetQLASerialNumber(unsigned char chan)
{
    // Format: QLA 1234-56 or QLA 1234-567.
    // String is terminated by 0 or 0xff.
    uint16_t address = 0x0000;
    uint8_t data[20];
    const size_t QLASNSize = 12;
    std::string sn;

    data[QLASNSize] = 0;  // make sure null-terminated
    for (size_t i = 0; i < QLASNSize; i++) {
        if (!PromReadByte25AA128(address, data[i], chan)) {
            if (chan == 0)
                std::cerr << "AmpIO::GetQLASerialNumber: failed to get QLA Serial Number" << std::endl;
            else
                std::cerr << "AmpIO::GetQLASerialNumber: failed to get QLA " << static_cast<unsigned int>(chan)
                          << " Serial Number" << std::endl;
            break;
        }
        if (data[i] == 0xff)
            data[i] = 0;
        address += 1;
    }
    if (strncmp((char *)data, "QLA ", 4) == 0 || strncmp((char *)data, "dRA ", 4) == 0)
        sn.assign((char *)data+4);
    return sn;
}